

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::const_equals(char *str,vm_val_t *val)

{
  int iVar1;
  uint uVar2;
  ushort *puVar3;
  
  if (val->typ == VM_OBJ) {
    iVar1 = CVmObjStringBuffer::is_string_buffer_obj((val->val).obj);
    if (iVar1 != 0) {
      iVar1 = CVmObjStringBuffer::equals_str
                        ((CVmObjStringBuffer *)
                         (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff)),
                         str);
      return iVar1;
    }
  }
  puVar3 = (ushort *)vm_val_t::get_as_string(val);
  uVar2 = 0;
  if ((puVar3 != (ushort *)0x0) && (*(ushort *)str == *puVar3)) {
    iVar1 = bcmp(str + 2,puVar3 + 1,(ulong)*(ushort *)str);
    uVar2 = (uint)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

int CVmObjString::const_equals(VMG_ const char *str, const vm_val_t *val)
{
    const char *str2;
    size_t len;

    /* if the other value is a string buffer, compare to its contents */
    if (val->typ == VM_OBJ
        && CVmObjStringBuffer::is_string_buffer_obj(vmg_ val->val.obj))
        return ((CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj))
            ->equals_str(str);

    /* get the other value as a string */
    str2 = val->get_as_string(vmg0_);

    /* if the object doesn't have an underlying string, we don't match */
    if (str2 == 0)
        return FALSE;

    /* 
     *   if their lengths match, and the bytes match exactly, we have a
     *   match; otherwise, they're not equal 
     */
    len = vmb_get_len(str);
    return (len == vmb_get_len(str2)
            && memcmp(str + VMB_LEN, str2 + VMB_LEN, len) == 0);
}